

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void prvTidyFixAnchors(TidyDocImpl *doc,Node *node,Bool wantName,Bool wantId)

{
  Node *pNVar1;
  bool bVar2;
  Bool BVar3;
  int iVar4;
  uint uVar5;
  AttVal *av;
  AttVal *attr;
  bool bVar6;
  bool local_52;
  bool local_51;
  Bool IdHasValue;
  Bool NameHasValue;
  Bool NameEmitted;
  Bool IdEmitted;
  Bool hadId;
  Bool hadName;
  AttVal *id;
  AttVal *name;
  Node *next;
  Bool wantId_local;
  Bool wantName_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  pNVar1 = node;
  while (_wantId_local = pNVar1, _wantId_local != (Node *)0x0) {
    pNVar1 = _wantId_local->next;
    BVar3 = prvTidyIsAnchorElement(doc,_wantId_local);
    if (BVar3 != no) {
      av = prvTidyAttrGetById(_wantId_local,TidyAttr_NAME);
      attr = prvTidyAttrGetById(_wantId_local,TidyAttr_ID);
      bVar2 = false;
      bVar6 = false;
      if ((av == (AttVal *)0x0) || (attr == (AttVal *)0x0)) {
        if ((av == (AttVal *)0x0) || (wantId == no)) {
          if ((attr != (AttVal *)0x0) && (wantName != no)) {
            uVar5 = prvTidyNodeAttributeVersions(_wantId_local,TidyAttr_NAME);
            bVar6 = (uVar5 & doc->lexer->versionEmitted) != 0;
            if (bVar6) {
              prvTidyRepairAttrValue(doc,_wantId_local,"name",attr->value);
            }
          }
        }
        else {
          uVar5 = prvTidyNodeAttributeVersions(_wantId_local,TidyAttr_ID);
          if ((uVar5 & doc->lexer->versionEmitted) != 0) {
            BVar3 = prvTidyIsValidHTMLID(av->value);
            if (BVar3 == no) {
              prvTidyReportAttrError(doc,_wantId_local,av,0x24d);
            }
            else {
              prvTidyRepairAttrValue(doc,_wantId_local,anon_var_dwarf_140e1 + 0x2b,av->value);
            }
            bVar2 = BVar3 != no;
          }
        }
      }
      else {
        local_51 = false;
        if (av != (AttVal *)0x0) {
          local_51 = av->value != (tmbstr)0x0;
        }
        local_52 = false;
        if (attr != (AttVal *)0x0) {
          local_52 = attr->value != (tmbstr)0x0;
        }
        if ((local_51 != local_52) ||
           (((local_51 != false && (local_52 != false)) &&
            (iVar4 = prvTidytmbstrcmp(av->value,attr->value), iVar4 != 0)))) {
          prvTidyReportAttrError(doc,_wantId_local,av,0x242);
        }
      }
      if (((attr != (AttVal *)0x0) && (wantId == no)) &&
         ((av != (AttVal *)0x0 || ((wantName == no || (bVar6)))))) {
        if (wantName == no) {
          prvTidyRemoveAnchorByNode(doc,attr->value,_wantId_local);
        }
        prvTidyRemoveAttribute(doc,_wantId_local,attr);
      }
      if (((av != (AttVal *)0x0) && (wantName == no)) &&
         ((attr != (AttVal *)0x0 || ((wantId == no || (bVar2)))))) {
        if (wantId == no) {
          prvTidyRemoveAnchorByNode(doc,av->value,_wantId_local);
        }
        prvTidyRemoveAttribute(doc,_wantId_local,av);
      }
    }
    if (_wantId_local->content != (Node *)0x0) {
      prvTidyFixAnchors(doc,_wantId_local->content,wantName,wantId);
    }
  }
  return;
}

Assistant:

void TY_(FixAnchors)(TidyDocImpl* doc, Node *node, Bool wantName, Bool wantId)
{
    Node* next;

    while (node)
    {
        next = node->next;

        if (TY_(IsAnchorElement)(doc, node))
        {
            AttVal *name = TY_(AttrGetById)(node, TidyAttr_NAME);
            AttVal *id = TY_(AttrGetById)(node, TidyAttr_ID);
            Bool hadName = name!=NULL;
            Bool hadId = id!=NULL;
            Bool IdEmitted = no;
            Bool NameEmitted = no;

            /* todo: how are empty name/id attributes handled? */

            if (name && id)
            {
                Bool NameHasValue = AttrHasValue(name);
                Bool IdHasValue = AttrHasValue(id);
                if ( (NameHasValue != IdHasValue) ||
                     (NameHasValue && IdHasValue &&
                     TY_(tmbstrcmp)(name->value, id->value) != 0 ) )
                    TY_(ReportAttrError)( doc, node, name, ID_NAME_MISMATCH);
            }
            else if (name && wantId)
            {
                if (TY_(NodeAttributeVersions)( node, TidyAttr_ID )
                    & doc->lexer->versionEmitted)
                {
                    if (TY_(IsValidHTMLID)(name->value))
                    {
                        TY_(RepairAttrValue)(doc, node, "id", name->value);
                        IdEmitted = yes;
                    }
                    else
                        TY_(ReportAttrError)(doc, node, name, INVALID_XML_ID);
                 }
            }
            else if (id && wantName)
            {
                if (TY_(NodeAttributeVersions)( node, TidyAttr_NAME )
                    & doc->lexer->versionEmitted)
                {
                    /* todo: do not assume id is valid */
                    TY_(RepairAttrValue)(doc, node, "name", id->value);
                    NameEmitted = yes;
                }
            }

            if (id && !wantId
                /* make sure that Name has been emitted if requested */
                && (hadName || !wantName || NameEmitted) ) {
                if (!wantId && !wantName)
                    TY_(RemoveAnchorByNode)(doc, id->value, node);
                TY_(RemoveAttribute)(doc, node, id);
            }

            if (name && !wantName
                /* make sure that Id has been emitted if requested */
                && (hadId || !wantId || IdEmitted) ) {
                if (!wantId && !wantName)
                    TY_(RemoveAnchorByNode)(doc, name->value, node);
                TY_(RemoveAttribute)(doc, node, name);
            }
        }

        if (node->content)
            TY_(FixAnchors)(doc, node->content, wantName, wantId);

        node = next;
    }
}